

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

string * __thiscall
ProblemAloha::transmissionStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,ProblemAloha *this,Index status)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (status < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)0x0,
               (ulong)(&DAT_004f6740 + *(int *)(&DAT_004f6740 + (ulong)status * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

string ProblemAloha::transmissionStatusToString(Index status) const
{
    string str;
    switch(status){
    case(SUCCESS):
        str = "Succ";
        break;
    case(IDLEo):
        str = "Idle";
        break;
    case(COLLISION):
        str = "Coll";
        break;
    }
    return(str);
}